

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

int32_t __thiscall icu_63::ServiceEnumeration::count(ServiceEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  
  UVar1 = upToDate(this,status);
  iVar2 = 0;
  if (UVar1 != '\0') {
    iVar2 = (this->_ids).count;
  }
  return iVar2;
}

Assistant:

virtual int32_t count(UErrorCode& status) const {
        return upToDate(status) ? _ids.size() : 0;
    }